

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_andnot_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  int iVar1;
  int iVar2;
  _Bool _Var3;
  container_t *c2_00;
  container_t *pcVar4;
  roaring_array_t *in_RSI;
  roaring_array_t *in_RDI;
  container_t *c1_1;
  container_t *c;
  container_t *c2;
  container_t *c1;
  uint16_t s2;
  uint16_t s1;
  uint8_t type2;
  uint8_t type1;
  int pos2;
  int pos1;
  int intersection_size;
  int length2;
  int length1;
  uint8_t result_type;
  uint32_t in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffae;
  uint8_t in_stack_ffffffffffffffaf;
  roaring_array_t *in_stack_ffffffffffffffb0;
  uint8_t *in_stack_ffffffffffffffb8;
  uint8_t type2_00;
  ushort local_2e;
  ushort local_2c;
  uint8_t local_2a;
  uint8_t in_stack_ffffffffffffffd7;
  int iVar5;
  int iVar6;
  int local_20;
  
  iVar1 = in_RDI->size;
  iVar2 = in_RSI->size;
  local_20 = 0;
  if (iVar2 != 0) {
    if (iVar1 == 0) {
      roaring_bitmap_clear((roaring_bitmap_t *)0x108f80);
    }
    else {
      iVar6 = 0;
      iVar5 = 0;
      local_2c = ra_get_key_at_index(in_RDI,0);
      local_2e = ra_get_key_at_index(in_RSI,(uint16_t)iVar5);
      while( true ) {
        while (local_2c != local_2e) {
          if (local_2c < local_2e) {
            if (iVar6 != local_20) {
              in_stack_ffffffffffffffb0 =
                   (roaring_array_t *)
                   ra_get_container_at_index(in_RDI,(uint16_t)iVar6,&stack0xffffffffffffffd7);
              ra_replace_key_and_container_at_index
                        (in_RDI,local_20,local_2c,in_stack_ffffffffffffffb0,
                         in_stack_ffffffffffffffd7);
            }
            local_20 = local_20 + 1;
            iVar6 = iVar6 + 1;
            if (iVar6 == iVar1) goto LAB_001091f3;
            local_2c = ra_get_key_at_index(in_RDI,(uint16_t)iVar6);
          }
          else {
            iVar5 = ra_advance_until(in_stack_ffffffffffffffb0,
                                     CONCAT11(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffae),
                                     in_stack_ffffffffffffffa8);
            if (iVar5 == iVar2) goto LAB_001091f3;
            local_2e = ra_get_key_at_index(in_RSI,(uint16_t)iVar5);
          }
        }
        c2_00 = ra_get_container_at_index(in_RDI,(uint16_t)iVar6,&stack0xffffffffffffffd7);
        pcVar4 = ra_get_container_at_index(in_RSI,(uint16_t)iVar5,&local_2a);
        type2_00 = (uint8_t)((ulong)pcVar4 >> 0x38);
        if (in_stack_ffffffffffffffd7 == '\x04') {
          in_stack_ffffffffffffffb8 =
               (uint8_t *)
               container_andnot((container_t *)CONCAT44(iVar6,iVar5),'\x04',c2_00,type2_00,
                                in_stack_ffffffffffffffb8);
          shared_container_free((shared_container_t *)0x109042);
        }
        else {
          in_stack_ffffffffffffffb8 =
               (uint8_t *)
               container_iandnot((container_t *)CONCAT44(iVar6,iVar5),in_stack_ffffffffffffffd7,
                                 c2_00,type2_00,in_stack_ffffffffffffffb8);
        }
        _Var3 = container_nonzero_cardinality
                          ((container_t *)
                           CONCAT17(in_stack_ffffffffffffffaf,
                                    CONCAT16(in_stack_ffffffffffffffae,
                                             CONCAT24(in_stack_ffffffffffffffac,
                                                      in_stack_ffffffffffffffa8))),'\0');
        if (_Var3) {
          ra_replace_key_and_container_at_index
                    (in_RDI,local_20,local_2c,in_stack_ffffffffffffffb8,'\0');
          local_20 = local_20 + 1;
        }
        else {
          container_free(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf);
        }
        iVar6 = iVar6 + 1;
        iVar5 = iVar5 + 1;
        if ((iVar6 == iVar1) || (iVar5 == iVar2)) break;
        local_2c = ra_get_key_at_index(in_RDI,(uint16_t)iVar6);
        local_2e = ra_get_key_at_index(in_RSI,(uint16_t)iVar5);
      }
LAB_001091f3:
      if (iVar6 < iVar1) {
        if (local_20 < iVar6) {
          ra_copy_range(in_stack_ffffffffffffffb0,
                        CONCAT13(in_stack_ffffffffffffffaf,
                                 CONCAT12(in_stack_ffffffffffffffae,in_stack_ffffffffffffffac)),
                        in_stack_ffffffffffffffa8,0);
        }
        local_20 = (iVar1 - iVar6) + local_20;
      }
      ra_downsize(in_RDI,local_20);
    }
  }
  return;
}

Assistant:

void roaring_bitmap_andnot_inplace(roaring_bitmap_t *x1,
                                   const roaring_bitmap_t *x2) {
    assert(x1 != x2);

    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;
    int intersection_size = 0;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_clear(x1);
        return;
    }

    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);

            // We do the computation "in place" only when c1 is not a shared
            // container. Rationale: using a shared container safely with in
            // place computation would require making a copy and then doing the
            // computation in place which is likely less efficient than avoiding
            // in place entirely and always generating a new container.

            container_t *c;
            if (type1 == SHARED_CONTAINER_TYPE) {
                c = container_andnot(c1, type1, c2, type2, &result_type);
                shared_container_free(CAST_shared(c1));  // release
            } else {
                c = container_iandnot(c1, type1, c2, type2, &result_type);
            }

            if (container_nonzero_cardinality(c, result_type)) {
                ra_replace_key_and_container_at_index(&x1->high_low_container,
                                                      intersection_size++, s1,
                                                      c, result_type);
            } else {
                container_free(c, result_type);
            }

            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            if (pos1 != intersection_size) {
                container_t *c1 = ra_get_container_at_index(
                    &x1->high_low_container, (uint16_t)pos1, &type1);

                ra_replace_key_and_container_at_index(
                    &x1->high_low_container, intersection_size, s1, c1, type1);
            }
            intersection_size++;
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }

    if (pos1 < length1) {
        // all containers between intersection_size and
        // pos1 are junk.  However, they have either been moved
        // (thus still referenced) or involved in an iandnot
        // that will clean up all containers that could not be reused.
        // Thus we should not free the junk containers between
        // intersection_size and pos1.
        if (pos1 > intersection_size) {
            // left slide of remaining items
            ra_copy_range(&x1->high_low_container, pos1, length1,
                          intersection_size);
        }
        // else current placement is fine
        intersection_size += (length1 - pos1);
    }
    ra_downsize(&x1->high_low_container, intersection_size);
}